

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinDeserializer<std::__cxx11::list<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_void>
     ::deserialize_elems<InputStream>(_List_node_base *param_1,uint param_2,InputStream *param_3)

{
  iterator __end0;
  _List_node_base *p_Var1;
  
  std::__cxx11::
  list<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((list<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)param_1,(ulong)param_2);
  for (p_Var1 = (((_List_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&param_1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      p_Var1 != param_1;
      p_Var1 = (((_List_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    BuiltinDeserializer<std::vector<int,_std::allocator<int>_>,_void>::deserialize<InputStream>
              ((vector<int,_std::allocator<int>_> *)(p_Var1 + 1),param_3);
  }
  return;
}

Assistant:

static void deserialize_elems(
    std::false_type  /* no insert */,
    Sequence& s, std::uint32_t size, InputStream& istream
  )
  {
    resize(has_resize<Sequence>{}, s, size);

    deserialize_elems_noinsert(
      is_sequence_batch_deserializable<Sequence>{},
      is_proxy_sequence<Sequence>{},
      s, size, istream
    );
  }